

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O2

bool vkt::ssbo::anon_unknown_15::compareComponents
               (DataType scalarType,void *ref,void *res,int numComps)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  float fVar7;
  
  uVar4 = 0;
  if (0 < numComps) {
    uVar4 = (ulong)(uint)numComps;
  }
  uVar3 = 0;
  if (scalarType == TYPE_FLOAT) {
    do {
      bVar5 = uVar4 == uVar3;
      if (bVar5) {
        return bVar5;
      }
      fVar7 = *(float *)((long)res + uVar3 * 4) - *(float *)((long)ref + uVar3 * 4);
      uVar6 = -(uint)(-fVar7 <= fVar7);
      uVar3 = uVar3 + 1;
    } while ((float)(~uVar6 & (uint)-fVar7 | (uint)fVar7 & uVar6) < 0.05);
  }
  else if (scalarType == TYPE_BOOL) {
    do {
      bVar5 = uVar4 == uVar3;
      if (bVar5) {
        return bVar5;
      }
      lVar1 = uVar3 * 4;
      lVar2 = uVar3 * 4;
      uVar3 = uVar3 + 1;
    } while ((*(int *)((long)res + lVar2) == 0) != (*(int *)((long)ref + lVar1) != 0));
  }
  else {
    do {
      bVar5 = uVar4 == uVar3;
      if (bVar5) {
        return bVar5;
      }
      lVar1 = uVar3 * 4;
      lVar2 = uVar3 * 4;
      uVar3 = uVar3 + 1;
    } while (*(int *)((long)ref + lVar1) == *(int *)((long)res + lVar2));
  }
  return bVar5;
}

Assistant:

bool compareComponents (glu::DataType scalarType, const void* ref, const void* res, int numComps)
{
	if (scalarType == glu::TYPE_FLOAT)
	{
		const float threshold = 0.05f; // Same as used in shaders - should be fine for values being used.

		for (int ndx = 0; ndx < numComps; ndx++)
		{
			const float		refVal		= *((const float*)ref + ndx);
			const float		resVal		= *((const float*)res + ndx);

			if (deFloatAbs(resVal - refVal) >= threshold)
				return false;
		}
	}
	else if (scalarType == glu::TYPE_BOOL)
	{
		for (int ndx = 0; ndx < numComps; ndx++)
		{
			const deUint32	refVal		= *((const deUint32*)ref + ndx);
			const deUint32	resVal		= *((const deUint32*)res + ndx);

			if ((refVal != 0) != (resVal != 0))
				return false;
		}
	}
	else
	{
		DE_ASSERT(scalarType == glu::TYPE_INT || scalarType == glu::TYPE_UINT);

		for (int ndx = 0; ndx < numComps; ndx++)
		{
			const deUint32	refVal		= *((const deUint32*)ref + ndx);
			const deUint32	resVal		= *((const deUint32*)res + ndx);

			if (refVal != resVal)
				return false;
		}
	}

	return true;
}